

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

void __thiscall libchars::terminal_driver::get_terminal_width_and_height(terminal_driver *this)

{
  int iVar1;
  debug *this_00;
  double __x;
  bool local_41;
  ushort local_38;
  ushort local_36;
  winsize ws_1;
  size_t y;
  size_t x;
  winsize ws;
  terminal_driver *this_local;
  
  if ((this->control_enabled & 1U) == 0) {
    this->t_rows = 0;
    this->t_cols = 0;
    this->changed = false;
  }
  else if (this->fd_w < 1) {
    this->t_rows = 0;
    this->t_cols = 0;
    this->changed = true;
  }
  else {
    ws = (winsize)this;
    if ((this->size_initialized & 1U) == 0) {
      x._2_2_ = 0;
      iVar1 = ioctl(this->fd_w,0x5413,&x);
      if (-1 < iVar1) {
        this->size_initialized = true;
        this->t_cols = (ulong)x._2_2_;
        this->t_rows = (ulong)(ushort)x;
        cursor_save(this);
        cursor_to_xy(this,this->t_cols + 1,this->t_rows + 1);
        y = 0;
        ws_1.ws_row = 0;
        ws_1.ws_col = 0;
        ws_1.ws_xpixel = 0;
        ws_1.ws_ypixel = 0;
        cursor_position(this,&y,(size_t *)&ws_1,-1);
        cursor_restore(this);
        if ((y != this->t_cols) || (ws_1 != (winsize)this->t_rows)) {
          this->t_cols = y;
          this->t_rows = (size_t)ws_1;
          this->size_not_accurate = true;
        }
      }
    }
    else if ((this->size_not_accurate & 1U) == 0) {
      local_36 = 0;
      iVar1 = ioctl(this->fd_w,0x5413,&local_38);
      if ((-1 < iVar1) && ((this->t_cols != (ulong)local_36 || (this->t_rows != (ulong)local_38))))
      {
        this_00 = debug::initialize(0);
        debug::log(this_00,__x);
        local_41 = true;
        if (this->t_cols == 0) {
          local_41 = this->t_rows != 0;
        }
        this->changed = local_41;
        this->t_cols = (ulong)local_36;
        this->t_rows = (ulong)local_38;
      }
    }
  }
  return;
}

Assistant:

void terminal_driver::get_terminal_width_and_height()
    {
        if (!control_enabled) {
            t_cols = t_rows = 0;
            changed = false;
        }
        else if (fd_w > 0) {
            if (!size_initialized) {
                struct winsize ws;
                ws.ws_col = 0;
                if (ioctl(fd_w, TIOCGWINSZ, &ws) >= 0) {
                    size_initialized = true;
                    t_cols = ws.ws_col;
                    t_rows = ws.ws_row;
                    // make sure size is accurate
                    cursor_save();
                    cursor_to_xy(t_cols + 1, t_rows + 1);
                    size_t x = 0, y = 0;
                    cursor_position(x,y);
                    cursor_restore();
                    if (x != t_cols || y != t_rows) {
                        t_cols = x;
                        t_rows = y;
                        size_not_accurate = true;
                    }
                }
            }
            else if (size_not_accurate) {
                // do not try to update window size
                return;
            }
            else {
                struct winsize ws;
                ws.ws_col = 0;
                if (ioctl(fd_w, TIOCGWINSZ, &ws) >= 0) {
                    if (t_cols != ws.ws_col || t_rows != ws.ws_row) {
                        LC_LOG_VERBOSE("window[%zux%zu]-->[%ux%u]",t_cols,t_rows,ws.ws_col,ws.ws_row);
                        changed = (t_cols != 0 || t_rows != 0);
                        t_cols = ws.ws_col;
                        t_rows = ws.ws_row;
                    }
                }
            }
        }
        else {
            t_cols = t_rows = 0;
            changed = true;
        }
    }